

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parameter.cpp
# Opt level: O2

void __thiscall ezc3d::ParametersNS::GroupNS::Parameter::set(Parameter *this,double data)

{
  double local_50;
  _Vector_base<double,_std::allocator<double>_> local_48;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_28;
  
  local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_50 = data;
  std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
            ((vector<double,std::allocator<double>> *)&local_48,&local_50);
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  set(this,(vector<double,_std::allocator<double>_> *)&local_48,
      (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_28);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_48);
  return;
}

Assistant:

void ezc3d::ParametersNS::GroupNS::Parameter::set(double data) {
  set(std::vector<double>() = {data});
}